

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::String> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryReadlink
          (Maybe<kj::String> *__return_storage_ptr__,InMemoryDirectory *this,PathPtr path)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  long lVar1;
  size_t sVar2;
  String *pSVar3;
  char *size;
  char *pcVar4;
  undefined8 extraout_RDX;
  char *value;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_58 [24];
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_40;
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  
  sVar2 = path.parts.size_;
  pSVar3 = path.parts.ptr;
  if (sVar2 == 1) {
    this_00 = &this->impl;
    local_58[0] = 0;
    kj::_::Mutex::lock(&this_00->mutex,1);
    local_38.ptr = (Waiter *)&(this->impl).value;
    if ((pSVar3->content).size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pSVar3->content).ptr;
    }
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)local_38.ptr;
    local_40 = this_00;
    Impl::tryGetEntry((Impl *)local_58,name);
    lVar1 = CONCAT71(local_58._1_7_,local_58[0]);
    if (lVar1 == 0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else if (*(int *)(lVar1 + 0x18) == 3) {
      pcVar4 = *(char **)(lVar1 + 0x30);
      value = pcVar4;
      if (pcVar4 != (char *)0x0) {
        value = *(char **)(lVar1 + 0x28);
      }
      size = (char *)0x0;
      if (pcVar4 != (char *)0x0) {
        size = pcVar4 + -1;
      }
      heapString((String *)local_58,value,(size_t)size);
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.content.ptr =
           (char *)CONCAT71(local_58._1_7_,local_58[0]);
      (__return_storage_ptr__->ptr).field_1.value.content.size_ = local_58._8_8_;
      (__return_storage_ptr__->ptr).field_1.value.content.disposer =
           (ArrayDisposer *)local_58._16_8_;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
                ((Fault *)local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x6a8,FAILED,(char *)0x0,"\"not a symlink\"",(char (*) [14])"not a symlink");
      (__return_storage_ptr__->ptr).isSet = false;
      kj::_::Debug::Fault::~Fault((Fault *)local_58);
    }
    kj::_::Mutex::unlock(&this_00->mutex,SHARED,(Waiter *)0x0);
  }
  else if (sVar2 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
              ((Fault *)local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x45f,FAILED,(char *)0x0,"\"not a symlink\"",(char (*) [14])"not a symlink");
    (__return_storage_ptr__->ptr).isSet = false;
    kj::_::Debug::Fault::~Fault((Fault *)local_58);
  }
  else {
    if ((pSVar3->content).size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pSVar3->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar4;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)local_58,name_00);
    if ((InMemoryFileFactory *)local_58._8_8_ == (InMemoryFileFactory *)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      (**(code **)(*(_func_int **)local_58._8_8_ + 0x60))
                (__return_storage_ptr__,local_58._8_8_,pSVar3 + 1,sVar2 - 1);
      (*(code *)**(undefined8 **)CONCAT71(local_58._1_7_,local_58[0]))
                ((undefined8 *)CONCAT71(local_58._1_7_,local_58[0]),
                 (InMemoryFileFactory *)
                 (local_58._8_8_ + *(long *)(*(_func_int **)local_58._8_8_ + -0x10)),extraout_RDX);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<String> tryReadlink(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a symlink") { return kj::none; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asSymlink(lock, entry);
      } else {
        return kj::none;
      }
    }